

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void kmp_destroy_affinity_mask(void **mask)

{
  kmp_msg_t local_20;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if ((__kmp_env_consistency_check != 0) && (*mask == (void *)0x0)) {
    __kmp_msg_format(&local_20,0x40072,"kmp_destroy_affinity_mask");
    __kmp_fatal();
  }
  (*__kmp_affinity_dispatch->_vptr_KMPAffinity[5])(__kmp_affinity_dispatch,*mask);
  *mask = (void *)0x0;
  return;
}

Assistant:

void FTN_STDCALL FTN_DESTROY_AFFINITY_MASK(void **mask) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
// Nothing
#else
  // We really only NEED serial initialization here.
  kmp_affin_mask_t *mask_internals;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (__kmp_env_consistency_check) {
    if (*mask == NULL) {
      KMP_FATAL(AffinityInvalidMask, "kmp_destroy_affinity_mask");
    }
  }
  mask_internals = (kmp_affin_mask_t *)(*mask);
  __kmp_affinity_dispatch->deallocate_mask(mask_internals);
  *mask = NULL;
#endif
}